

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::callFooWhenResolved
          (TestMoreStuffImpl *this,CallFooWhenResolvedContext context)

{
  PromiseArena *pPVar1;
  void *pvVar2;
  undefined8 uVar3;
  WirePointer *pWVar4;
  CapTableReader *pCVar5;
  OwnPromiseNode node;
  void *pvVar6;
  PromiseArena *in_RDX;
  TransformPromiseNodeBase *this_00;
  Client cap;
  OwnPromiseNode intermediate;
  Reader params;
  undefined1 local_d0 [16];
  CapTableReader *pCStack_c0;
  WirePointer *local_b8;
  PromiseArena *pPStack_b0;
  pointer_____offset_0x10___ *local_a0;
  SegmentReader *local_98;
  CapTableReader *pCStack_90;
  OwnPromiseNode local_88;
  undefined8 local_80;
  StructReader local_78;
  PointerReader local_48;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (*(code *)**(undefined8 **)in_RDX->bytes)(&local_48);
  local_b8 = local_48.pointer;
  pPStack_b0 = (PromiseArena *)local_48._24_8_;
  local_d0._8_8_ = local_48.segment;
  pCStack_c0 = local_48.capTable;
  PointerReader::getStruct(&local_78,(PointerReader *)(local_d0 + 8),(word *)0x0);
  if (local_78.pointerCount == 0) {
    local_78.nestingLimit = 0x7fffffff;
    local_78.pointers = (WirePointer *)0x0;
    local_78.segment = (SegmentReader *)0x0;
    local_78.capTable = (CapTableReader *)0x0;
  }
  pPStack_b0 = (PromiseArena *)CONCAT44(pPStack_b0._4_4_,local_78.nestingLimit);
  local_d0._8_8_ = local_78.segment;
  pCStack_c0 = local_78.capTable;
  local_b8 = local_78.pointers;
  PointerReader::getCapability(&local_48);
  local_98 = local_48.segment;
  pCStack_90 = local_48.capTable;
  local_a0 = &Capability::Client::typeinfo;
  Capability::Client::whenResolved((Client *)local_d0);
  (**(code **)(**(long **)((long)&local_98 + (long)local_a0[-3]) + 0x20))(&pCStack_c0);
  uVar3 = local_d0._0_8_;
  local_d0._8_8_ = &Capability::Client::typeinfo;
  pPVar1 = ((PromiseArenaMember *)local_d0._0_8_)->arena;
  pPStack_b0 = in_RDX;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_d0._0_8_ - (long)pPVar1) < 0x40) {
    pvVar6 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar6 + 0x3c0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)local_d0,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++:1079:34)>
               ::anon_class_32_2_dc087ca5_for_func::operator());
    *(undefined ***)((long)pvVar6 + 0x3c0) = &PTR_destroy_006e9eb8;
    pvVar2 = ((ClientHook *)(local_d0._8_8_ + -0x20))->brand;
    *(undefined8 *)((long)pvVar6 + 1000) = *(undefined8 *)(local_d0 + (long)pvVar2 + 8);
    *(undefined8 *)((long)pvVar6 + 0x3f0) = *(undefined8 *)((long)&pCStack_c0 + (long)pvVar2);
    *(undefined8 *)((long)&pCStack_c0 + (long)pvVar2) = 0;
    *(pointer_____offset_0x10___ **)((long)pvVar6 + 0x3e0) = &Capability::Client::typeinfo;
    *(PromiseArena **)((long)pvVar6 + 0x3f8) = pPStack_b0;
    *(void **)((long)pvVar6 + 0x3c8) = pvVar6;
  }
  else {
    ((PromiseArenaMember *)local_d0._0_8_)->arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_d0._0_8_ + -0x40);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)local_d0,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++:1079:34)>
               ::anon_class_32_2_dc087ca5_for_func::operator());
    ((PromiseArenaMember *)(uVar3 + -0x40))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_006e9eb8;
    pvVar2 = ((ClientHook *)(local_d0._8_8_ + -0x20))->brand;
    ((PromiseArenaMember *)(uVar3 + -0x20))->arena = *(PromiseArena **)(local_d0 + (long)pvVar2 + 8)
    ;
    ((PromiseArenaMember *)(uVar3 + -0x10))->_vptr_PromiseArenaMember =
         *(_func_int ***)((long)&pCStack_c0 + (long)pvVar2);
    *(undefined8 *)((long)&pCStack_c0 + (long)pvVar2) = 0;
    ((PromiseArenaMember *)(uVar3 + -0x20))->_vptr_PromiseArenaMember =
         (_func_int **)&Capability::Client::typeinfo;
    ((PromiseArenaMember *)(uVar3 + -0x10))->arena = pPStack_b0;
    ((PromiseArenaMember *)(uVar3 + -0x40))->arena = pPVar1;
  }
  local_48.segment = (SegmentReader *)&DAT_005053bd;
  local_48.capTable = (CapTableReader *)&DAT_0050541c;
  local_48.pointer = (WirePointer *)0x4c0000058b;
  local_88.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_80,&local_88,(SourceLocation *)&local_48);
  node.ptr = local_88.ptr;
  *(undefined8 *)&this->super_Server = local_80;
  if ((TransformPromiseNodeBase *)local_88.ptr != (TransformPromiseNodeBase *)0x0) {
    local_88.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  pWVar4 = local_b8;
  if (local_b8 != (WirePointer *)0x0) {
    local_b8 = (WirePointer *)0x0;
    (**pCStack_c0->_vptr_CapTableReader)
              (pCStack_c0,(long)&(pWVar4->offsetAndKind).value + *(long *)((long)*pWVar4 + -0x10));
  }
  uVar3 = local_d0._0_8_;
  if ((PromiseArenaMember *)local_d0._0_8_ != (PromiseArenaMember *)0x0) {
    local_d0._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  pCVar5 = pCStack_90;
  if (pCStack_90 != (CapTableReader *)0x0) {
    pCStack_90 = (CapTableReader *)0x0;
    (*(code *)local_98->arena->_vptr_Arena)
              (local_98,pCVar5->_vptr_CapTableReader[-2] + (long)&pCVar5->_vptr_CapTableReader);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::callFooWhenResolved(CallFooWhenResolvedContext context) {
  ++callCount;

  auto params = context.getParams();
  auto cap = params.getCap();

  return cap.whenResolved().then([KJ_CPCAP(cap),KJ_CPCAP(context)]() mutable {
    auto request = cap.fooRequest();
    request.setI(123);
    request.setJ(true);

    return request.send().then(
        [KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
          EXPECT_EQ("foo", response.getX());
          context.getResults().setS("bar");
        }